

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  uint uVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr pxVar6;
  int iVar7;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs < 2) {
      iVar7 = 0xc;
LAB_001bf1e5:
      xmlXPathErr(ctxt,iVar7);
      return;
    }
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    iVar7 = ctxt->valueNr;
    if (0 < (long)iVar7) {
      uVar2 = iVar7 - 1;
      ctxt->valueNr = uVar2;
      ppxVar1 = ctxt->valueTab;
      if (iVar7 == 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar5 = ppxVar1[(long)iVar7 + -2];
      }
      ctxt->value = pxVar5;
      pxVar5 = ppxVar1[uVar2];
      ppxVar1[uVar2] = (xmlXPathObjectPtr)0x0;
      if (pxVar5 != (xmlXPathObjectPtr)0x0) {
        if (pxVar5->type != XPATH_STRING) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
          return;
        }
        uVar2 = nargs + 1;
        while( true ) {
          if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
            xmlXPathStringFunction(ctxt,1);
          }
          iVar7 = ctxt->valueNr;
          if ((long)iVar7 < 1) break;
          uVar3 = iVar7 - 1;
          ctxt->valueNr = uVar3;
          ppxVar1 = ctxt->valueTab;
          if (iVar7 == 1) {
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar6 = ppxVar1[(long)iVar7 + -2];
          }
          ctxt->value = pxVar6;
          pxVar6 = ppxVar1[uVar3];
          ppxVar1[uVar3] = (xmlXPathObjectPtr)0x0;
          if (pxVar6 == (xmlXPathObjectPtr)0x0) break;
          if (pxVar6->type != XPATH_STRING) {
            xmlXPathReleaseObject(ctxt->context,pxVar6);
            break;
          }
          pxVar4 = xmlStrcat(pxVar6->stringval,pxVar5->stringval);
          if (pxVar4 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          pxVar6->stringval = pxVar5->stringval;
          pxVar5->stringval = pxVar4;
          xmlXPathReleaseObject(ctxt->context,pxVar6);
          uVar2 = uVar2 - 1;
          if (uVar2 < 3) {
            xmlXPathValuePush(ctxt,pxVar5);
            return;
          }
        }
        xmlXPathReleaseObject(ctxt->context,pxVar5);
        iVar7 = 0xb;
        goto LAB_001bf1e5;
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur, newobj;
    xmlChar *tmp;

    if (ctxt == NULL) return;
    if (nargs < 2) {
	CHECK_ARITY(2);
    }

    CAST_TO_STRING;
    cur = xmlXPathValuePop(ctxt);
    if ((cur == NULL) || (cur->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, cur);
	return;
    }
    nargs--;

    while (nargs > 0) {
	CAST_TO_STRING;
	newobj = xmlXPathValuePop(ctxt);
	if ((newobj == NULL) || (newobj->type != XPATH_STRING)) {
	    xmlXPathReleaseObject(ctxt->context, newobj);
	    xmlXPathReleaseObject(ctxt->context, cur);
	    XP_ERROR(XPATH_INVALID_TYPE);
	}
	tmp = xmlStrcat(newobj->stringval, cur->stringval);
        if (tmp == NULL)
            xmlXPathPErrMemory(ctxt);
	newobj->stringval = cur->stringval;
	cur->stringval = tmp;
	xmlXPathReleaseObject(ctxt->context, newobj);
	nargs--;
    }
    xmlXPathValuePush(ctxt, cur);
}